

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O2

void execute_tests(void)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  FILE *__src;
  istream *piVar4;
  ostream *poVar5;
  long lVar6;
  char *__rhs;
  int __val;
  int __val_00;
  string *this;
  string out_line;
  string exp_line;
  string local_540;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ifstream expected_file;
  ifstream out_file;
  
  stop.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  fclose(_stdout);
  __src = fdopen(old_stdout,"w");
  memcpy(_stdout,__src,0xd8);
  std::ifstream::ifstream(&out_file,(string *)&out_name_abi_cxx11_,_S_in);
  std::ifstream::ifstream(&expected_file,(string *)&expected_name_abi_cxx11_,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&exp_line,"!! Problems reading from file \'",&out_name_abi_cxx11_);
    std::operator+(&out_line,&exp_line,"\'\n");
    write_colored_text(&out_line,red);
    std::__cxx11::string::~string((string *)&out_line);
    std::__cxx11::string::~string((string *)&exp_line);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::operator+(&exp_line,"!! Problems reading from file \'",&expected_name_abi_cxx11_);
    std::operator+(&out_line,&exp_line,"\'\n");
    write_colored_text(&out_line,red);
    std::__cxx11::string::~string((string *)&out_line);
    std::__cxx11::string::~string((string *)&exp_line);
  }
  else if (cVar1 != '\0') {
    std::__cxx11::string::string((string *)&out_line,"\nExecuting tests:",(allocator *)&exp_line);
    write_colored_text(&out_line,blue);
    std::__cxx11::string::~string((string *)&out_line);
    std::__cxx11::string::string((string *)&out_line,"\n----------------\n",(allocator *)&exp_line);
    write_colored_text(&out_line,blue);
    std::__cxx11::string::~string((string *)&out_line);
    out_line._M_dataplus._M_p = (pointer)&out_line.field_2;
    out_line._M_string_length = 0;
    exp_line._M_dataplus._M_p = (pointer)&exp_line.field_2;
    exp_line._M_string_length = 0;
    __val = 0;
    out_line.field_2._M_local_buf[0] = '\0';
    exp_line.field_2._M_local_buf[0] = '\0';
    __val_00 = 0;
LAB_00105f80:
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&out_file,(string *)&out_line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&expected_file,(string *)&exp_line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) goto LAB_00106000;
      std::__cxx11::string::string
                ((string *)&local_540,"You produced at least one line to much of output: ",
                 (allocator *)&local_500);
      write_colored_text(&local_540,red);
      std::__cxx11::string::~string((string *)&local_540);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&out_line);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00105ffc;
    }
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&expected_file,(string *)&exp_line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      __val = __val + 1;
      std::__cxx11::to_string(&local_520,__val);
      std::operator+(&local_500,"You failed to produce expected line ",&local_520);
      std::operator+(&local_540,&local_500,":  ");
      write_colored_text(&local_540,red);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&exp_line);
      std::endl<char,std::char_traits<char>>(poVar5);
      __val_00 = __val_00 + 1;
    }
    if (__val_00 < 1) {
      std::__cxx11::to_string(&local_520,__val);
      std::operator+(&local_500,"Yes, no errors, all ",&local_520);
      std::operator+(&local_540,&local_500," lines of output are correct!\n");
      write_colored_text(&local_540,green);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_500);
      this = &local_520;
    }
    else {
      std::__cxx11::to_string(&local_4c0,__val_00);
      std::operator+(&local_4a0,"You produced ",&local_4c0);
      std::operator+(&local_480,&local_4a0," wrong line");
      __rhs = "s";
      if (__val_00 == 1) {
        __rhs = "";
      }
      std::operator+(&local_460,&local_480,__rhs);
      std::operator+(&local_520,&local_460," of totally ");
      std::__cxx11::to_string(&local_4e0,__val);
      std::operator+(&local_500,&local_520,&local_4e0);
      std::operator+(&local_540,&local_500," lines of expected output!\n");
      write_colored_text(&local_540,magenta);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      this = &local_4c0;
    }
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::~string((string *)&exp_line);
    goto LAB_001063c3;
  }
  std::__cxx11::string::string
            ((string *)&out_line,"-> Tests will be skipped !!\n",(allocator *)&exp_line);
  write_colored_text(&out_line,red);
LAB_001063c3:
  std::__cxx11::string::~string((string *)&out_line);
  std::ifstream::close();
  std::ifstream::close();
  lVar6 = (long)stop.__d.__r - (long)start.__d.__r;
  std::operator<<((ostream *)&std::cout,"Execution time for actual code: ");
  if (0x7ce < lVar6 / 1000 + 999U) {
    poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
    std::operator<<(poVar5,"\'");
  }
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar5 = std::operator<<(poVar5," microseconds");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ifstream::~ifstream(&expected_file);
  std::ifstream::~ifstream(&out_file);
  return;
LAB_00106000:
  __val = __val + 1;
  bVar3 = std::operator!=(&out_line,&exp_line);
  if (bVar3) {
    std::__cxx11::to_string(&local_520,__val);
    std::operator+(&local_500,"Error: Line ",&local_520);
    std::operator+(&local_540,&local_500,":\t");
    write_colored_text(&local_540,red);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::string((string *)&local_540,"Expected: ",(allocator *)&local_500);
    write_colored_text(&local_540,yellow);
    std::__cxx11::string::~string((string *)&local_540);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&exp_line);
    std::operator<<(poVar5,"\t");
    std::__cxx11::string::string((string *)&local_540,"Your output: ",(allocator *)&local_500);
    write_colored_text(&local_540,cyan);
    std::__cxx11::string::~string((string *)&local_540);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&out_line);
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_00105ffc:
    __val_00 = __val_00 + 1;
  }
  goto LAB_00105f80;
}

Assistant:

void execute_tests() {

    // Stop the timer:
    stop = chrono::high_resolution_clock::now();

    /*
     * Recreate the standard output to the terminal:
     * https://stackoverflow.com/questions/1908687/how-to-redirect-the-output-back-to-the-screen-after-freopenout-txt-a-stdo/1910044#1910044
     * Somehow, this only works once - the second time, the output didn't work anymore 
     *    (e.g., when I tried to call this file string_in_out_testing.cpp in a loop)
     */
    fclose(stdout);
    FILE *fp_out = fdopen(old_stdout, "w");    // Open old stdout as a stream
    // Reassign the terminal to stdin/stdout:
    *stdout = *fp_out;                          // NOLINT(misc-non-copyable-objects)

    /*
     * Recreate the standard input to the terminal.
     * DOESN'T YET WORK ?!   
     * (But this is not necessary for this project, except if I would want to run multiple times in a sequence)
     */
//    fclose(stdin);
//    FILE  *fp_in = fdopen(old_stdin, "r");  // Open old stdin as a stream
//    *stdin = *fp_in;                        // NOLINT(misc-non-copyable-objects)



    // Open 'out_name' and 'expected_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:
    ifstream out_file(out_name);
    ifstream expected_file(expected_name);

    bool skip_tests = false;
    if (!out_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + out_name + "'\n");
        skip_tests = true;
    }
    if (!expected_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + expected_name + "'\n");
        skip_tests = true;
    }

    // Run actual tests: do string-comparison line by line
    if (skip_tests) {
        write_colored_text("-> Tests will be skipped !!\n");
    } else {
        write_colored_text("\nExecuting tests:", blue);
        write_colored_text("\n----------------\n", blue);
//        cout << "\n----------------" << endl;
        int line_nr = 0, error_count = 0;
        string out_line, exp_line;

        while (getline(out_file, out_line)) {
            if (getline(expected_file, exp_line)) {
                line_nr++;
                /*
                 * NOTE: I wanted to compare the two string as described in
                 * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
                 * With:
                 *      if (out_line.compare(exp_line) == 0)
                 * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
                 *      equality operator instead"
                 *
                 * It seems the above construct would be great to see if a string is shorter or longer than the other:
                 *      int difference = out_line.compare(exp_line);
                 *
                 * But here, I only want to know if they are the same.
                 * -> after automatic refactoring
                 */
                if (out_line != exp_line) {
                    write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                    write_colored_text("Expected: ", yellow);
                    cout << exp_line << "\t";
                    write_colored_text("Your output: ", cyan);
                    cout << out_line << endl;
                    error_count++;
                }
            } else {
                write_colored_text("You produced at least one line to much of output: ");
                cout << out_line << endl;
                error_count++;
            }
        }

        // Check, if 'expected' has more lines than 'out':
        while (getline(expected_file, exp_line)) {
            line_nr++;
            write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
            cout << exp_line << endl;
            error_count++;
        }

        if (error_count > 0) {
            write_colored_text(
                    "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                    " of totally " + to_string(line_nr) + " lines of expected output!\n",
                    magenta);
        } else {
            write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                               green);
        }
    }

    out_file.close();
    expected_file.close();

    // Subtract stop and start time-points and cast it to required unit. 
    // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
    // Use duration_cast() function: 
    long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
    long int milli = micro / 1000;
    micro %= 1000;
    cout << "Execution time for actual code: ";
    if (milli) cout << milli << "'";
    cout << micro << " microseconds" << endl;
}